

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  size_type sVar1;
  pointer pMVar2;
  pointer pbVar3;
  ostream *poVar4;
  pointer pbVar5;
  pointer pMVar6;
  TextAttributes local_a8;
  Text local_88;
  
  sVar1 = (this->messageLabel)._M_string_length;
  if (sVar1 != 0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->stream,(this->messageLabel)._M_dataplus._M_p,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  pMVar2 = (this->messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar6 = (this->messages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar6 != pMVar2; pMVar6 = pMVar6 + 1) {
    if ((this->printInfoMessages != false) || (pMVar6->type != Info)) {
      poVar4 = this->stream;
      local_a8.initialIndent = 0xffffffffffffffff;
      local_a8.width = 0x4f;
      local_a8.tabChar = '\t';
      local_a8.indent = 2;
      Tbc::Text::Text(&local_88,&pMVar6->message,&local_a8);
      pbVar3 = local_88.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_88.lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar3; pbVar5 = pbVar5 + 1
          ) {
        if (pbVar5 != local_88.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88.lines);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
        operator_delete(local_88.str._M_dataplus._M_p,local_88.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
  }
  return;
}

Assistant:

void printMessage() const {
                if( !messageLabel.empty() )
                    stream << messageLabel << ":" << "\n";
                for( std::vector<MessageInfo>::const_iterator it = messages.begin(), itEnd = messages.end();
                        it != itEnd;
                        ++it ) {
                    // If this assertion is a warning ignore any INFO messages
                    if( printInfoMessages || it->type != ResultWas::Info )
                        stream << Text( it->message, TextAttributes().setIndent(2) ) << "\n";
                }
            }